

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg-traversal.h
# Opt level: O2

void wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::
     doStartIfFalse(ParamLiveness *self,Expression **currp)

{
  CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness> *this;
  BasicBlock *__from;
  char *__to;
  
  std::
  vector<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
  ::push_back(&(self->super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>).
               super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
               ifLastBlockStack,
              &(self->super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>).
               super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
               currBasicBlock);
  this = (CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness> *)
         (self->super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>).
         super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
         ifLastBlockStack.
         super__Vector_base<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
         ._M_impl.super__Vector_impl_data._M_finish[-2];
  __from = startBasicBlock((CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>
                            *)self);
  link(this,(char *)__from,__to);
  return;
}

Assistant:

static void doStartIfFalse(SubType* self, Expression** currp) {
    self->ifLastBlockStack.push_back(
      self->currBasicBlock); // the ifTrue fallthrough
    self->link(self->ifLastBlockStack[self->ifLastBlockStack.size() - 2],
               self->startBasicBlock()); // before if -> ifFalse
  }